

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSendSession.cpp
# Opt level: O2

void __thiscall FileSendSession::on_error(FileSendSession *this,Poll *p,int event)

{
  path pStack_48;
  
  if ((this->error).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::__cxx11::string::string((string *)&pStack_48,(string *)&this->file);
    std::function<void_(boost::filesystem::path)>::operator()(&this->error,&pStack_48);
    std::__cxx11::string::~string((string *)&pStack_48);
  }
  Subscriber::on_error(&this->super_Subscriber,p,event);
  return;
}

Assistant:

void FileSendSession::on_error(Poll &p, int event) {
  if (this->error)
    this->error(file);
  Subscriber::on_error(p, event);
}